

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiveTraffic.cpp
# Opt level: O2

void XPluginStop(void)

{
  LTMainStop();
  WeatherStop();
  DataRefs::Stop(&dataRefs);
  DestroyWindow();
  LTImgWindowCleanup();
  CrashHandlerUnregister();
  return;
}

Assistant:

PLUGIN_API void    XPluginStop(void)
{
    try {
        // Cleanup aircraft handling (including XPMP library)
        LTMainStop();
        
        // Cleanup Weather module
        WeatherStop();
        
        // Cleanup dataRef registration, save config file
        dataRefs.Stop();
        
        // last chance to remove the message area window
        DestroyWindow();

        // cleanup ImGui stuff
        LTImgWindowCleanup();

#if IBM
        // Windows: Balance CoInitializeEx
        CoUninitialize();
#endif
    } catch (const std::exception& e) {
        LOG_MSG(logERR, ERR_TOP_LEVEL_EXCEPTION, e.what());
    } catch (...) {
    }
    // Unregister crash handler
    CrashHandlerUnregister();
}